

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

AnalogConsumer * __thiscall
AbstractModuleClient::subscribeAnalogData
          (AbstractModuleClient *this,size_t buffersize,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *channels)

{
  bool bVar1;
  undefined1 uVar2;
  SubType SVar3;
  AnalogConsumer *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  HFSubSockSettings sockinfo;
  AnalogConsumer *newsub;
  HFParsingInfo parseinfo;
  HighFreqDataType dt;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffaac;
  AnalogConsumer *in_stack_fffffffffffffab0;
  undefined7 in_stack_fffffffffffffab8;
  allocator *this_01;
  SubType type;
  HighFreqDataType *hf;
  HFSubSockSettings *this_02;
  HighFreqDataType *in_stack_fffffffffffffad8;
  HighFreqDataType *in_stack_fffffffffffffae0;
  allocator *paVar4;
  string *in_stack_fffffffffffffb28;
  string *in_stack_fffffffffffffb30;
  network_pimpl *in_stack_fffffffffffffb38;
  HFParsingInfo *in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffba4;
  HighFreqDataType *in_stack_fffffffffffffba8;
  AnalogConsumer *in_stack_fffffffffffffbb0;
  MlmWrap *in_stack_fffffffffffffbb8;
  string *in_stack_fffffffffffffbc8;
  string *in_stack_fffffffffffffbd0;
  MlmWrap *in_stack_fffffffffffffbd8;
  string *in_stack_fffffffffffffc68;
  string *in_stack_fffffffffffffc70;
  MlmWrap *in_stack_fffffffffffffc78;
  string local_228 [120];
  undefined4 local_1b0;
  allocator local_1a9;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [104];
  string *in_stack_fffffffffffffee8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [40];
  undefined4 local_18;
  AnalogConsumer *local_8;
  
  local_18 = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"analogstream",&local_41);
  paVar4 = &local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"Trodes",paVar4);
  bVar1 = MlmWrap::isHfTypeCurrentlySubbed
                    (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"analogstream",&local_a1);
    paVar4 = &local_c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Trodes",paVar4);
    local_8 = (AnalogConsumer *)
              MlmWrap::getHfSubObject
                        (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                         in_stack_fffffffffffffc68);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  else {
    hf = *(HighFreqDataType **)(in_RDI + 0x28);
    this_02 = (HFSubSockSettings *)&local_181;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"analogstream",(allocator *)this_02);
    this_01 = &local_1a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a8,"Trodes",this_01);
    network_pimpl::find_hfdt
              (in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator(&local_181);
    uVar2 = HighFreqDataType::isValid((HighFreqDataType *)in_stack_fffffffffffffab0);
    if ((bool)uVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_RDX,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)paVar4);
      HighFreqDataType::getDataFormat_abi_cxx11_
                ((HighFreqDataType *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      MlmWrap::createAnalogParsingInfo
                ((MlmWrap *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffee8);
      std::__cxx11::string::~string(local_228);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_01);
      type = (SubType)((ulong)this_01 >> 0x20);
      this_00 = (AnalogConsumer *)operator_new(0x458);
      HighFreqDataType::HighFreqDataType(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
      HFParsingInfo::HFParsingInfo((HFParsingInfo *)this_02,(HFParsingInfo *)hf);
      AnalogConsumer::AnalogConsumer
                (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba4,
                 in_stack_fffffffffffffb98);
      HFParsingInfo::~HFParsingInfo((HFParsingInfo *)this_00);
      HighFreqDataType::~HighFreqDataType((HighFreqDataType *)this_00);
      in_stack_fffffffffffffab0 = this_00;
      HighFreqDataType::HighFreqDataType(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
      SVar3 = HighFreqSub::getSubSockType((HighFreqSub *)this_00);
      HFSubSockSettings::HFSubSockSettings
                (this_02,hf,type,(hfs_data_callback_fn)CONCAT17(uVar2,in_stack_fffffffffffffab8),
                 in_stack_fffffffffffffab0);
      HighFreqDataType::~HighFreqDataType((HighFreqDataType *)in_stack_fffffffffffffab0);
      MlmWrap::addSubToList
                ((MlmWrap *)in_stack_fffffffffffffab0,(HighFreqSub *)CONCAT44(local_18,SVar3));
      HFSubSockSettings::HFSubSockSettings
                ((HFSubSockSettings *)in_stack_fffffffffffffab0,
                 (HFSubSockSettings *)CONCAT44(local_18,SVar3));
      MlmWrap::addHfTypeToSubbedList
                (in_stack_fffffffffffffbb8,(HFSubSockSettings *)in_stack_fffffffffffffbb0);
      HFSubSockSettings::~HFSubSockSettings((HFSubSockSettings *)0x1c07f3);
      local_1b0 = 1;
      local_8 = this_00;
      HFSubSockSettings::~HFSubSockSettings((HFSubSockSettings *)0x1c081b);
      HFParsingInfo::~HFParsingInfo((HFParsingInfo *)in_stack_fffffffffffffab0);
    }
    else {
      local_8 = (AnalogConsumer *)0x0;
      local_1b0 = 1;
    }
    HighFreqDataType::~HighFreqDataType((HighFreqDataType *)in_stack_fffffffffffffab0);
  }
  return local_8;
}

Assistant:

AnalogConsumer* AbstractModuleClient::subscribeAnalogData(size_t buffersize, std::vector<std::string> channels){
    if(isHfTypeCurrentlySubbed(hfType_ANALOG, TRODES_NETWORK_ID)){
        return (AnalogConsumer*)getHfSubObject(hfType_ANALOG, TRODES_NETWORK_ID);
    }
    HighFreqDataType dt = state->find_hfdt(hfType_ANALOG, TRODES_NETWORK_ID);
    if(!dt.isValid()){
        // std::cerr << error("Analog data could not be found on the network!");
        return NULL;
    }
    HFParsingInfo parseinfo = createAnalogParsingInfo(channels, dt.getDataFormat());
    AnalogConsumer* newsub = new AnalogConsumer(dt, buffersize, parseinfo);
    HFSubSockSettings sockinfo(dt, newsub->getSubSockType(), NULL, NULL);
    addSubToList(newsub);
    addHfTypeToSubbedList(sockinfo);
    return newsub;
}